

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O1

int it_ptm_read_sample_data(IT_SAMPLE *sample,int last,DUMBFILE *f)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  void *pvVar4;
  ushort uVar5;
  short sVar6;
  char cVar7;
  long lVar8;
  
  bVar1 = sample->flags;
  pvVar4 = malloc((long)(sample->length << (bVar1 >> 1 & 1)));
  sample->data = pvVar4;
  if (pvVar4 == (void *)0x0) {
    iVar3 = -1;
  }
  else {
    if ((bVar1 & 2) == 0) {
      if (0 < sample->length) {
        lVar8 = 0;
        cVar7 = '\0';
        do {
          iVar3 = dumbfile_getc(f);
          cVar2 = (char)iVar3;
          if (iVar3 < 1) {
            cVar2 = '\0';
          }
          cVar7 = cVar7 + cVar2;
          *(char *)((long)sample->data + lVar8) = cVar7;
          lVar8 = lVar8 + 1;
        } while (lVar8 < sample->length);
      }
    }
    else if (0 < sample->length) {
      lVar8 = 0;
      sVar6 = 0;
      do {
        iVar3 = dumbfile_getc(f);
        cVar7 = (char)iVar3;
        if (iVar3 < 1) {
          cVar7 = '\0';
        }
        iVar3 = dumbfile_getc(f);
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        uVar5 = cVar7 + sVar6;
        sVar6 = (short)(char)iVar3 + uVar5;
        *(ushort *)((long)sample->data + lVar8 * 2) = sVar6 * 0x100 | uVar5 & 0xff;
        lVar8 = lVar8 + 1;
      } while (lVar8 < sample->length);
    }
    iVar3 = dumbfile_error(f);
    iVar3 = -(uint)(last == 0 && iVar3 != 0);
  }
  return iVar3;
}

Assistant:

static int it_ptm_read_sample_data(IT_SAMPLE *sample, int last, DUMBFILE *f)
{
	int32 n;
	int s;

	sample->data = malloc(sample->length * (sample->flags & IT_SAMPLE_16BIT ? 2 : 1));
	if (!sample->data)
		return -1;

	s = 0;

	if (sample->flags & IT_SAMPLE_16BIT) {
		unsigned char a, b;
		for (n = 0; n < sample->length; n++) {
			a = s += (signed char) it_ptm_read_byte(f);
			b = s += (signed char) it_ptm_read_byte(f);
			((short *)sample->data)[n] = a | (b << 8);
		}
	} else {
		for (n = 0; n < sample->length; n++) {
			s += (signed char) it_ptm_read_byte(f);
			((signed char *)sample->data)[n] = s;
		}
	}

	if (dumbfile_error(f) && !last)
		return -1;

	return 0;
}